

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

bool __thiscall SafeQueue<WriterData>::empty(SafeQueue<WriterData> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  SafeQueue<WriterData> *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mtx);
  bVar1 = std::queue<WriterData,_std::deque<WriterData,_std::allocator<WriterData>_>_>::empty
                    (&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool empty() const
    {
        std::lock_guard lk(m_mtx);

        return m_queue.empty();
    }